

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t
zeGetFabricVertexExpProcAddrTable
          (ze_api_version_t version,ze_fabric_vertex_exp_dditable_t *pDdiTable)

{
  ze_api_version_t *pzVar1;
  ze_result_t result;
  ze_fabric_vertex_exp_dditable_t *dditable;
  ze_fabric_vertex_exp_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  pzVar1 = validation_layer::context;
  if (pDdiTable == (ze_fabric_vertex_exp_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (((int)*validation_layer::context >> 0x10 == (int)version >> 0x10) &&
          ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
    *(ze_pfnFabricVertexGetExp_t *)(validation_layer::context + 0x18a) = pDdiTable->pfnGetExp;
    pDdiTable->pfnGetExp = validation_layer::zeFabricVertexGetExp;
    *(ze_pfnFabricVertexGetSubVerticesExp_t *)(pzVar1 + 0x18c) = pDdiTable->pfnGetSubVerticesExp;
    pDdiTable->pfnGetSubVerticesExp = validation_layer::zeFabricVertexGetSubVerticesExp;
    *(ze_pfnFabricVertexGetPropertiesExp_t *)(pzVar1 + 0x18e) = pDdiTable->pfnGetPropertiesExp;
    pDdiTable->pfnGetPropertiesExp = validation_layer::zeFabricVertexGetPropertiesExp;
    *(ze_pfnFabricVertexGetDeviceExp_t *)(pzVar1 + 400) = pDdiTable->pfnGetDeviceExp;
    pDdiTable->pfnGetDeviceExp = validation_layer::zeFabricVertexGetDeviceExp;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetFabricVertexExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_fabric_vertex_exp_dditable_t* pDdiTable      ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.FabricVertexExp;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetExp                                   = pDdiTable->pfnGetExp;
    pDdiTable->pfnGetExp                                 = validation_layer::zeFabricVertexGetExp;

    dditable.pfnGetSubVerticesExp                        = pDdiTable->pfnGetSubVerticesExp;
    pDdiTable->pfnGetSubVerticesExp                      = validation_layer::zeFabricVertexGetSubVerticesExp;

    dditable.pfnGetPropertiesExp                         = pDdiTable->pfnGetPropertiesExp;
    pDdiTable->pfnGetPropertiesExp                       = validation_layer::zeFabricVertexGetPropertiesExp;

    dditable.pfnGetDeviceExp                             = pDdiTable->pfnGetDeviceExp;
    pDdiTable->pfnGetDeviceExp                           = validation_layer::zeFabricVertexGetDeviceExp;

    return result;
}